

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O3

bool pbrt::CatmullRomWeights(span<const_float> nodes,Float x,int *offset,span<float> weights)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  long lVar5;
  bool bVar6;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  float *pfVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  Float w3;
  Float w0;
  undefined1 auVar19 [16];
  int vb;
  size_t va;
  float fVar15;
  
  va = weights.n;
  pfVar8 = weights.ptr;
  uVar10 = nodes.n;
  pfVar11 = nodes.ptr;
  vb = 4;
  if (3 < va) {
    if ((x < *pfVar11) || (pfVar11[uVar10 - 1] < x)) {
      bVar6 = false;
    }
    else {
      uVar7 = uVar10 - 2;
      if ((long)uVar7 < 1) {
        uVar9 = 0;
      }
      else {
        lVar13 = 1;
        uVar9 = uVar7;
        do {
          uVar14 = uVar9 >> 1;
          uVar9 = ~uVar14 + uVar9;
          lVar5 = uVar14 + 1 + lVar13;
          if (x < pfVar11[(int)uVar14 + (int)lVar13]) {
            uVar9 = uVar14;
            lVar5 = lVar13;
          }
          lVar13 = lVar5;
        } while (0 < (long)uVar9);
        if (lVar13 - 1U < uVar7) {
          uVar7 = lVar13 - 1U;
        }
        uVar9 = 0;
        if (0 < lVar13) {
          uVar9 = uVar7;
        }
      }
      uVar12 = (int)uVar9 - 1;
      lVar13 = uVar9 << 0x20;
      *offset = uVar12;
      fVar17 = *(float *)((long)pfVar11 + (lVar13 >> 0x1e));
      fVar15 = *(float *)((long)pfVar11 + (lVar13 + 0x100000000 >> 0x1e));
      fVar3 = fVar15 - fVar17;
      auVar19._0_4_ = (x - fVar17) / fVar3;
      fVar1 = auVar19._0_4_ * auVar19._0_4_;
      fVar2 = auVar19._0_4_ * fVar1;
      auVar16 = vfmsub213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar2),
                                ZEXT416((uint)(fVar1 * 3.0)));
      fVar18 = auVar16._0_4_ + 1.0;
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * 3.0)),ZEXT416((uint)fVar2),
                               SUB6416(ZEXT464(0xc0000000),0));
      auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar1),
                                ZEXT416((uint)fVar2));
      auVar19._0_4_ = auVar16._0_4_ + auVar19._0_4_;
      pfVar8[1] = fVar18;
      pfVar8[2] = auVar4._0_4_;
      if ((int)uVar9 < 1) {
        fVar18 = fVar18 - auVar19._0_4_;
        fVar15 = 0.0;
        pfVar8[1] = fVar18;
      }
      else {
        auVar19._0_4_ = (fVar3 * auVar19._0_4_) / (fVar15 - pfVar11[uVar12]);
        auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar16._8_4_ = 0x80000000;
        auVar16._0_8_ = 0x8000000080000000;
        auVar16._12_4_ = 0x80000000;
        auVar16 = vxorps_avx512vl(auVar19,auVar16);
        fVar15 = auVar16._0_4_;
      }
      auVar19._0_4_ = auVar4._0_4_ + auVar19._0_4_;
      fVar2 = fVar2 - fVar1;
      *pfVar8 = fVar15;
      uVar7 = lVar13 + 0x200000000 >> 0x20;
      pfVar8[2] = auVar19._0_4_;
      if (uVar7 < uVar10) {
        fVar17 = (fVar3 * fVar2) / (pfVar11[uVar7] - fVar17);
        pfVar8[1] = fVar18 - fVar17;
      }
      else {
        pfVar8[1] = fVar18 - fVar2;
        pfVar8[2] = fVar2 + auVar19._0_4_;
        fVar17 = 0.0;
      }
      bVar6 = true;
      pfVar8[3] = fVar17;
    }
    return bVar6;
  }
  LogFatal<char_const(&)[15],char_const(&)[2],char_const(&)[15],unsigned_long&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.cpp"
             ,0x9f,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [15])0x2c827bd,
             (char (*) [2])0x87a7af,(char (*) [15])0x2c827bd,&va,(char (*) [2])0x87a7af,&vb);
}

Assistant:

bool CatmullRomWeights(pstd::span<const Float> nodes, Float x, int *offset,
                       pstd::span<Float> weights) {
    CHECK_GE(weights.size(), 4);
    // Return _false_ if _x_ is out of bounds
    if (!(x >= nodes.front() && x <= nodes.back()))
        return false;

    // Search for the interval _idx_ containing _x_
    int idx = FindInterval(nodes.size(), [&](int i) { return nodes[i] <= x; });
    *offset = idx - 1;
    Float x0 = nodes[idx], x1 = nodes[idx + 1];

    // Compute the $t$ parameter and powers
    Float t = (x - x0) / (x1 - x0), t2 = t * t, t3 = t2 * t;

    // Compute initial node weights $w_1$ and $w_2$
    weights[1] = 2 * t3 - 3 * t2 + 1;
    weights[2] = -2 * t3 + 3 * t2;

    // Compute first node weight $w_0$
    if (idx > 0) {
        Float w0 = (t3 - 2 * t2 + t) * (x1 - x0) / (x1 - nodes[idx - 1]);
        weights[0] = -w0;
        weights[2] += w0;
    } else {
        Float w0 = t3 - 2 * t2 + t;
        weights[0] = 0;
        weights[1] -= w0;
        weights[2] += w0;
    }

    // Compute last node weight $w_3$
    if (idx + 2 < nodes.size()) {
        Float w3 = (t3 - t2) * (x1 - x0) / (nodes[idx + 2] - x0);
        weights[1] -= w3;
        weights[3] = w3;
    } else {
        Float w3 = t3 - t2;
        weights[1] -= w3;
        weights[2] += w3;
        weights[3] = 0;
    }

    return true;
}